

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void value_suite::fail_float_as_null(void)

{
  bool bVar1;
  error_code eVar2;
  int local_78 [2];
  error_category *local_70;
  undefined8 local_58;
  type_conflict8 local_50 [2];
  undefined1 local_48 [8];
  error_code error;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)&error._M_cat,0.0);
  std::error_code::error_code((error_code *)local_48);
  local_50[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                          ((basic_variable<std::allocator<char>_> *)&error._M_cat,
                           (error_code *)local_48);
  local_58 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,double>
            ("data.value<float>(error)","0.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x15ce,"void value_suite::fail_float_as_null()",local_50,&local_58);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_48);
  boost::detail::test_impl
            ("!error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x15cf,"void value_suite::fail_float_as_null()",!bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::nullable>
            ((basic_variable<std::allocator<char>_> *)&error._M_cat,(error_code *)local_48);
  eVar2 = trial::dynamic::make_error_code(incompatible_type);
  local_70 = eVar2._M_cat;
  local_78[0] = eVar2._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x15d1,"void value_suite::fail_float_as_null()",local_48,local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error._M_cat);
  return;
}

Assistant:

void fail_float_as_null()
{
    variable data(0.0f);
    std::error_code error;
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<float>(error), 0.0);
    TRIAL_PROTOCOL_TEST(!error);
    data.value<nullable>(error);
    TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
}